

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOptimizedPixelReading.h
# Opt level: O1

void Imf_2_5::optimizedWriteToRGB
               (unsigned_short **readPtrRed,unsigned_short **readPtrGreen,
               unsigned_short **readPtrBlue,unsigned_short **writePtr,size_t *pixelsToCopySSE,
               size_t *pixelsToCopyNormal)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  unsigned_short uVar3;
  unsigned_short *puVar4;
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  unsigned_short uVar13;
  unsigned_short uVar14;
  unsigned_short uVar15;
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  size_t pixelCounter;
  ulong uVar20;
  size_t sVar21;
  bool bVar22;
  bool bVar23;
  undefined1 auVar24 [14];
  undefined1 auVar25 [14];
  undefined1 auVar26 [14];
  undefined1 auVar27 [14];
  undefined8 uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar32 [16];
  undefined1 auVar35 [16];
  undefined1 auVar38 [16];
  undefined1 auVar41 [16];
  undefined1 auVar44 [16];
  undefined1 auVar47 [16];
  undefined1 auVar50 [16];
  undefined1 auVar53 [16];
  undefined1 auVar56 [16];
  undefined1 auVar59 [16];
  undefined1 auVar62 [16];
  undefined1 auVar30 [16];
  undefined1 auVar33 [16];
  undefined1 auVar36 [16];
  undefined1 auVar39 [16];
  undefined1 auVar31 [16];
  undefined1 auVar34 [16];
  undefined1 auVar37 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar45 [16];
  undefined1 auVar48 [16];
  undefined1 auVar51 [16];
  undefined1 auVar43 [16];
  undefined1 auVar46 [16];
  undefined1 auVar49 [16];
  undefined1 auVar52 [16];
  undefined1 auVar54 [16];
  undefined1 auVar57 [16];
  undefined1 auVar60 [16];
  undefined1 auVar63 [16];
  undefined1 auVar55 [16];
  undefined1 auVar58 [16];
  undefined1 auVar61 [16];
  undefined1 auVar64 [16];
  
  uVar20 = (ulong)*readPtrGreen | (ulong)*readPtrRed | (ulong)*readPtrBlue;
  puVar4 = *writePtr;
  if (((ulong)puVar4 & 0xf) == 0 || (uVar20 & 0xf) == 0) {
    bVar22 = ((ulong)puVar4 & 0xf) == 0;
    if ((uVar20 & 0xf) != 0 && bVar22) {
      if (*pixelsToCopySSE != 0) {
        uVar20 = 0;
        do {
          auVar1 = *(undefined1 (*) [16])*readPtrRed;
          auVar2 = *(undefined1 (*) [16])*readPtrGreen;
          puVar4 = *readPtrBlue;
          uVar3 = puVar4[4];
          uVar13 = puVar4[5];
          uVar14 = puVar4[6];
          uVar15 = puVar4[7];
          auVar49._0_12_ = auVar1._0_12_;
          auVar49._12_2_ = auVar1._6_2_;
          auVar49._14_2_ = auVar2._6_2_;
          auVar48._12_4_ = auVar49._12_4_;
          auVar48._0_10_ = auVar1._0_10_;
          auVar48._10_2_ = auVar2._4_2_;
          auVar47._10_6_ = auVar48._10_6_;
          auVar47._0_8_ = auVar1._0_8_;
          auVar47._8_2_ = auVar1._4_2_;
          auVar37._12_2_ = auVar1._6_2_;
          auVar37._0_12_ = auVar49._0_12_;
          auVar37._14_2_ = puVar4[3];
          auVar36._12_4_ = auVar37._12_4_;
          auVar36._10_2_ = puVar4[2];
          auVar36._0_10_ = auVar48._0_10_;
          auVar35._10_6_ = auVar36._10_6_;
          auVar35._8_2_ = auVar1._4_2_;
          auVar35._0_8_ = auVar47._0_8_;
          auVar9._6_8_ = auVar35._8_8_;
          auVar9._4_2_ = puVar4[1];
          auVar9._2_2_ = auVar1._2_2_;
          auVar9._0_2_ = *puVar4;
          auVar61._0_12_ = auVar2._0_12_;
          auVar61._12_2_ = auVar2._6_2_;
          auVar61._14_2_ = puVar4[3];
          auVar60._12_4_ = auVar61._12_4_;
          auVar60._0_10_ = auVar2._0_10_;
          auVar60._10_2_ = puVar4[2];
          auVar59._10_6_ = auVar60._10_6_;
          auVar59._0_8_ = auVar2._0_8_;
          auVar59._8_2_ = auVar2._4_2_;
          auVar18._4_8_ = auVar59._8_8_;
          auVar18._2_2_ = puVar4[1];
          auVar18._0_2_ = auVar2._2_2_;
          puVar4 = *writePtr;
          *(ulong *)puVar4 = CONCAT44(auVar9._0_4_,CONCAT22(auVar2._0_2_,auVar1._0_2_));
          *(ulong *)(puVar4 + 4) = CONCAT44(auVar47._8_4_,auVar18._0_4_);
          puVar4 = *writePtr;
          *writePtr = puVar4 + 8;
          uVar28 = CONCAT44(auVar60._12_4_,auVar36._10_4_);
          auVar10._2_12_ = auVar1._4_12_;
          auVar10._0_2_ = uVar3;
          auVar26._0_6_ = CONCAT24(auVar1._10_2_,auVar10._0_4_ << 0x10);
          auVar26._6_2_ = uVar13;
          auVar26._8_2_ = auVar1._12_2_;
          auVar26._10_2_ = uVar14;
          auVar26._12_2_ = auVar1._14_2_;
          *(undefined8 *)(puVar4 + 8) = uVar28;
          *(ulong *)(puVar4 + 0xc) =
               CONCAT44((int)((uint6)auVar26._0_6_ >> 0x10),CONCAT22(auVar2._8_2_,auVar1._8_2_));
          puVar4 = *writePtr;
          *writePtr = puVar4 + 8;
          *(ulong *)(puVar4 + 8) =
               CONCAT44((int)(CONCAT24(auVar2._12_2_,CONCAT22(auVar1._12_2_,auVar2._10_2_)) >> 0x10)
                        ,CONCAT22(uVar13,auVar2._10_2_));
          *(ulong *)(puVar4 + 0xc) =
               CONCAT44((int)(CONCAT24(uVar15,CONCAT22(auVar2._14_2_,uVar14)) >> 0x10),
                        auVar26._10_4_);
          *writePtr = *writePtr + 8;
          *readPtrBlue = *readPtrBlue + 8;
          *readPtrGreen = *readPtrGreen + 8;
          *readPtrRed = *readPtrRed + 8;
          uVar20 = uVar20 + 1;
        } while (uVar20 < *pixelsToCopySSE);
      }
    }
    else {
      bVar23 = (uVar20 & 0xf) != 0;
      if ((((ulong)puVar4 & 0xf) == 0) || (bVar23)) {
        if ((!bVar23 && bVar22) && (*pixelsToCopySSE != 0)) {
          uVar20 = 0;
          do {
            auVar1 = *(undefined1 (*) [16])*readPtrRed;
            auVar2 = *(undefined1 (*) [16])*readPtrGreen;
            puVar4 = *readPtrBlue;
            uVar3 = puVar4[4];
            uVar13 = puVar4[5];
            uVar14 = puVar4[6];
            uVar15 = puVar4[7];
            auVar52._0_12_ = auVar1._0_12_;
            auVar52._12_2_ = auVar1._6_2_;
            auVar52._14_2_ = auVar2._6_2_;
            auVar51._12_4_ = auVar52._12_4_;
            auVar51._0_10_ = auVar1._0_10_;
            auVar51._10_2_ = auVar2._4_2_;
            auVar50._10_6_ = auVar51._10_6_;
            auVar50._0_8_ = auVar1._0_8_;
            auVar50._8_2_ = auVar1._4_2_;
            auVar40._12_2_ = auVar1._6_2_;
            auVar40._0_12_ = auVar52._0_12_;
            auVar40._14_2_ = puVar4[3];
            auVar39._12_4_ = auVar40._12_4_;
            auVar39._10_2_ = puVar4[2];
            auVar39._0_10_ = auVar51._0_10_;
            auVar38._10_6_ = auVar39._10_6_;
            auVar38._8_2_ = auVar1._4_2_;
            auVar38._0_8_ = auVar50._0_8_;
            auVar11._6_8_ = auVar38._8_8_;
            auVar11._4_2_ = puVar4[1];
            auVar11._2_2_ = auVar1._2_2_;
            auVar11._0_2_ = *puVar4;
            auVar64._0_12_ = auVar2._0_12_;
            auVar64._12_2_ = auVar2._6_2_;
            auVar64._14_2_ = puVar4[3];
            auVar63._12_4_ = auVar64._12_4_;
            auVar63._0_10_ = auVar2._0_10_;
            auVar63._10_2_ = puVar4[2];
            auVar62._10_6_ = auVar63._10_6_;
            auVar62._0_8_ = auVar2._0_8_;
            auVar62._8_2_ = auVar2._4_2_;
            auVar19._4_8_ = auVar62._8_8_;
            auVar19._2_2_ = puVar4[1];
            auVar19._0_2_ = auVar2._2_2_;
            puVar4 = *writePtr;
            *(ulong *)puVar4 = CONCAT44(auVar11._0_4_,CONCAT22(auVar2._0_2_,auVar1._0_2_));
            *(ulong *)(puVar4 + 4) = CONCAT44(auVar50._8_4_,auVar19._0_4_);
            puVar4 = *writePtr;
            *writePtr = puVar4 + 8;
            uVar28 = CONCAT44(auVar63._12_4_,auVar39._10_4_);
            auVar12._2_12_ = auVar1._4_12_;
            auVar12._0_2_ = uVar3;
            auVar27._0_6_ = CONCAT24(auVar1._10_2_,auVar12._0_4_ << 0x10);
            auVar27._6_2_ = uVar13;
            auVar27._8_2_ = auVar1._12_2_;
            auVar27._10_2_ = uVar14;
            auVar27._12_2_ = auVar1._14_2_;
            *(undefined8 *)(puVar4 + 8) = uVar28;
            *(ulong *)(puVar4 + 0xc) =
                 CONCAT44((int)((uint6)auVar27._0_6_ >> 0x10),CONCAT22(auVar2._8_2_,auVar1._8_2_));
            puVar4 = *writePtr;
            *writePtr = puVar4 + 8;
            *(ulong *)(puVar4 + 8) =
                 CONCAT44((int)(CONCAT24(auVar2._12_2_,CONCAT22(auVar1._12_2_,auVar2._10_2_)) >>
                               0x10),CONCAT22(uVar13,auVar2._10_2_));
            *(ulong *)(puVar4 + 0xc) =
                 CONCAT44((int)(CONCAT24(uVar15,CONCAT22(auVar2._14_2_,uVar14)) >> 0x10),
                          auVar27._10_4_);
            *writePtr = *writePtr + 8;
            *readPtrBlue = *readPtrBlue + 8;
            *readPtrGreen = *readPtrGreen + 8;
            *readPtrRed = *readPtrRed + 8;
            uVar20 = uVar20 + 1;
          } while (uVar20 < *pixelsToCopySSE);
        }
      }
      else if (*pixelsToCopySSE != 0) {
        uVar20 = 0;
        do {
          auVar1 = *(undefined1 (*) [16])*readPtrRed;
          auVar2 = *(undefined1 (*) [16])*readPtrGreen;
          puVar4 = *readPtrBlue;
          uVar3 = puVar4[4];
          uVar13 = puVar4[5];
          uVar14 = puVar4[6];
          uVar15 = puVar4[7];
          auVar43._0_12_ = auVar1._0_12_;
          auVar43._12_2_ = auVar1._6_2_;
          auVar43._14_2_ = auVar2._6_2_;
          auVar42._12_4_ = auVar43._12_4_;
          auVar42._0_10_ = auVar1._0_10_;
          auVar42._10_2_ = auVar2._4_2_;
          auVar41._10_6_ = auVar42._10_6_;
          auVar41._0_8_ = auVar1._0_8_;
          auVar41._8_2_ = auVar1._4_2_;
          auVar31._12_2_ = auVar1._6_2_;
          auVar31._0_12_ = auVar43._0_12_;
          auVar31._14_2_ = puVar4[3];
          auVar30._12_4_ = auVar31._12_4_;
          auVar30._10_2_ = puVar4[2];
          auVar30._0_10_ = auVar42._0_10_;
          auVar29._10_6_ = auVar30._10_6_;
          auVar29._8_2_ = auVar1._4_2_;
          auVar29._0_8_ = auVar41._0_8_;
          auVar5._6_8_ = auVar29._8_8_;
          auVar5._4_2_ = puVar4[1];
          auVar5._2_2_ = auVar1._2_2_;
          auVar5._0_2_ = *puVar4;
          auVar55._0_12_ = auVar2._0_12_;
          auVar55._12_2_ = auVar2._6_2_;
          auVar55._14_2_ = puVar4[3];
          auVar54._12_4_ = auVar55._12_4_;
          auVar54._0_10_ = auVar2._0_10_;
          auVar54._10_2_ = puVar4[2];
          auVar53._10_6_ = auVar54._10_6_;
          auVar53._0_8_ = auVar2._0_8_;
          auVar53._8_2_ = auVar2._4_2_;
          auVar16._4_8_ = auVar53._8_8_;
          auVar16._2_2_ = puVar4[1];
          auVar16._0_2_ = auVar2._2_2_;
          puVar4 = *writePtr;
          *(ulong *)puVar4 = CONCAT44(auVar5._0_4_,CONCAT22(auVar2._0_2_,auVar1._0_2_));
          *(ulong *)(puVar4 + 4) = CONCAT44(auVar41._8_4_,auVar16._0_4_);
          puVar4 = *writePtr;
          *writePtr = puVar4 + 8;
          uVar28 = CONCAT44(auVar54._12_4_,auVar30._10_4_);
          auVar6._2_12_ = auVar1._4_12_;
          auVar6._0_2_ = uVar3;
          auVar24._0_6_ = CONCAT24(auVar1._10_2_,auVar6._0_4_ << 0x10);
          auVar24._6_2_ = uVar13;
          auVar24._8_2_ = auVar1._12_2_;
          auVar24._10_2_ = uVar14;
          auVar24._12_2_ = auVar1._14_2_;
          *(undefined8 *)(puVar4 + 8) = uVar28;
          *(ulong *)(puVar4 + 0xc) =
               CONCAT44((int)((uint6)auVar24._0_6_ >> 0x10),CONCAT22(auVar2._8_2_,auVar1._8_2_));
          puVar4 = *writePtr;
          *writePtr = puVar4 + 8;
          *(ulong *)(puVar4 + 8) =
               CONCAT44((int)(CONCAT24(auVar2._12_2_,CONCAT22(auVar1._12_2_,auVar2._10_2_)) >> 0x10)
                        ,CONCAT22(uVar13,auVar2._10_2_));
          *(ulong *)(puVar4 + 0xc) =
               CONCAT44((int)(CONCAT24(uVar15,CONCAT22(auVar2._14_2_,uVar14)) >> 0x10),
                        auVar24._10_4_);
          *writePtr = *writePtr + 8;
          *readPtrBlue = *readPtrBlue + 8;
          *readPtrGreen = *readPtrGreen + 8;
          *readPtrRed = *readPtrRed + 8;
          uVar20 = uVar20 + 1;
        } while (uVar20 < *pixelsToCopySSE);
      }
    }
  }
  else if (*pixelsToCopySSE != 0) {
    uVar20 = 0;
    do {
      auVar1 = *(undefined1 (*) [16])*readPtrRed;
      auVar2 = *(undefined1 (*) [16])*readPtrGreen;
      puVar4 = *readPtrBlue;
      uVar3 = puVar4[4];
      uVar13 = puVar4[5];
      uVar14 = puVar4[6];
      uVar15 = puVar4[7];
      auVar46._0_12_ = auVar1._0_12_;
      auVar46._12_2_ = auVar1._6_2_;
      auVar46._14_2_ = auVar2._6_2_;
      auVar45._12_4_ = auVar46._12_4_;
      auVar45._0_10_ = auVar1._0_10_;
      auVar45._10_2_ = auVar2._4_2_;
      auVar44._10_6_ = auVar45._10_6_;
      auVar44._0_8_ = auVar1._0_8_;
      auVar44._8_2_ = auVar1._4_2_;
      auVar34._12_2_ = auVar1._6_2_;
      auVar34._0_12_ = auVar46._0_12_;
      auVar34._14_2_ = puVar4[3];
      auVar33._12_4_ = auVar34._12_4_;
      auVar33._10_2_ = puVar4[2];
      auVar33._0_10_ = auVar45._0_10_;
      auVar32._10_6_ = auVar33._10_6_;
      auVar32._8_2_ = auVar1._4_2_;
      auVar32._0_8_ = auVar44._0_8_;
      auVar7._6_8_ = auVar32._8_8_;
      auVar7._4_2_ = puVar4[1];
      auVar7._2_2_ = auVar1._2_2_;
      auVar7._0_2_ = *puVar4;
      auVar58._0_12_ = auVar2._0_12_;
      auVar58._12_2_ = auVar2._6_2_;
      auVar58._14_2_ = puVar4[3];
      auVar57._12_4_ = auVar58._12_4_;
      auVar57._0_10_ = auVar2._0_10_;
      auVar57._10_2_ = puVar4[2];
      auVar56._10_6_ = auVar57._10_6_;
      auVar56._0_8_ = auVar2._0_8_;
      auVar56._8_2_ = auVar2._4_2_;
      auVar17._4_8_ = auVar56._8_8_;
      auVar17._2_2_ = puVar4[1];
      auVar17._0_2_ = auVar2._2_2_;
      puVar4 = *writePtr;
      *(ulong *)puVar4 = CONCAT44(auVar7._0_4_,CONCAT22(auVar2._0_2_,auVar1._0_2_));
      *(ulong *)(puVar4 + 4) = CONCAT44(auVar44._8_4_,auVar17._0_4_);
      puVar4 = *writePtr;
      *writePtr = puVar4 + 8;
      uVar28 = CONCAT44(auVar57._12_4_,auVar33._10_4_);
      auVar8._2_12_ = auVar1._4_12_;
      auVar8._0_2_ = uVar3;
      auVar25._0_6_ = CONCAT24(auVar1._10_2_,auVar8._0_4_ << 0x10);
      auVar25._6_2_ = uVar13;
      auVar25._8_2_ = auVar1._12_2_;
      auVar25._10_2_ = uVar14;
      auVar25._12_2_ = auVar1._14_2_;
      *(undefined8 *)(puVar4 + 8) = uVar28;
      *(ulong *)(puVar4 + 0xc) =
           CONCAT44((int)((uint6)auVar25._0_6_ >> 0x10),CONCAT22(auVar2._8_2_,auVar1._8_2_));
      puVar4 = *writePtr;
      *writePtr = puVar4 + 8;
      *(ulong *)(puVar4 + 8) =
           CONCAT44((int)(CONCAT24(auVar2._12_2_,CONCAT22(auVar1._12_2_,auVar2._10_2_)) >> 0x10),
                    CONCAT22(uVar13,auVar2._10_2_));
      *(ulong *)(puVar4 + 0xc) =
           CONCAT44((int)(CONCAT24(uVar15,CONCAT22(auVar2._14_2_,uVar14)) >> 0x10),auVar25._10_4_);
      *writePtr = *writePtr + 8;
      *readPtrBlue = *readPtrBlue + 8;
      *readPtrGreen = *readPtrGreen + 8;
      *readPtrRed = *readPtrRed + 8;
      uVar20 = uVar20 + 1;
    } while (uVar20 < *pixelsToCopySSE);
  }
  for (sVar21 = *pixelsToCopyNormal; sVar21 != 0; sVar21 = sVar21 - 1) {
    puVar4 = *readPtrRed;
    *readPtrRed = puVar4 + 1;
    uVar3 = *puVar4;
    puVar4 = *writePtr;
    *writePtr = puVar4 + 1;
    *puVar4 = uVar3;
    puVar4 = *readPtrGreen;
    *readPtrGreen = puVar4 + 1;
    uVar3 = *puVar4;
    puVar4 = *writePtr;
    *writePtr = puVar4 + 1;
    *puVar4 = uVar3;
    puVar4 = *readPtrBlue;
    *readPtrBlue = puVar4 + 1;
    uVar3 = *puVar4;
    puVar4 = *writePtr;
    *writePtr = puVar4 + 1;
    *puVar4 = uVar3;
  }
  return;
}

Assistant:

EXR_FORCEINLINE 
void optimizedWriteToRGB (unsigned short*& readPtrRed,
                          unsigned short*& readPtrGreen,
                          unsigned short*& readPtrBlue,
                          unsigned short*& writePtr,
                          const size_t& pixelsToCopySSE,
                          const size_t& pixelsToCopyNormal)
{
    bool readPtrAreAligned = true;

    readPtrAreAligned &= isPointerSSEAligned(readPtrRed);
    readPtrAreAligned &= isPointerSSEAligned(readPtrGreen);
    readPtrAreAligned &= isPointerSSEAligned(readPtrBlue);

    bool writePtrIsAligned = isPointerSSEAligned(writePtr);

    if (!readPtrAreAligned && !writePtrIsAligned)
    {
        writeToRGBSSETemplate<false, false> ((__m128i*&)readPtrRed,
                                             (__m128i*&)readPtrGreen,
                                             (__m128i*&)readPtrBlue,
                                             (__m128i*&)writePtr,
                                             pixelsToCopySSE);
    }
    else if (!readPtrAreAligned && writePtrIsAligned)
    {
        writeToRGBSSETemplate<false, true> ((__m128i*&)readPtrRed,
                                            (__m128i*&)readPtrGreen,
                                            (__m128i*&)readPtrBlue,
                                            (__m128i*&)writePtr,
                                            pixelsToCopySSE);
    }
    else if (readPtrAreAligned && !writePtrIsAligned)
    {
        writeToRGBSSETemplate<true, false> ((__m128i*&)readPtrRed,
                                            (__m128i*&)readPtrGreen,
                                            (__m128i*&)readPtrBlue,
                                            (__m128i*&)writePtr,
                                            pixelsToCopySSE);
    }
    else if (readPtrAreAligned && writePtrIsAligned)
    {
        writeToRGBSSETemplate<true, true> ((__m128i*&)readPtrRed,
                                           (__m128i*&)readPtrGreen,
                                           (__m128i*&)readPtrBlue,
                                           (__m128i*&)writePtr,
                                           pixelsToCopySSE);
    }


    writeToRGBNormal (readPtrRed, readPtrGreen, readPtrBlue,
                      writePtr, pixelsToCopyNormal);
}